

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O0

int Abc_NtkQuantify(Abc_Ntk_t *pNtk,int fUniv,int iVar,int fVerbose)

{
  Abc_Aig_t *pAVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *local_80;
  Abc_Obj_t *local_58;
  int local_44;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  int local_18;
  int fVerbose_local;
  int iVar_local;
  int fUniv_local;
  Abc_Ntk_t *pNtk_local;
  
  vNodes._4_4_ = fVerbose;
  local_18 = iVar;
  fVerbose_local = fUniv;
  _iVar_local = pNtk;
  iVar2 = Abc_NtkIsStrash(pNtk);
  iVar3 = local_18;
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                  ,0x58,"int Abc_NtkQuantify(Abc_Ntk_t *, int, int, int)");
  }
  iVar2 = Abc_NtkCiNum(_iVar_local);
  if (iVar3 < iVar2) {
    pNext = Abc_NtkCi(_iVar_local,local_18);
    pObj = (Abc_Obj_t *)Abc_NtkDfsReverseNodes(_iVar_local,&pNext,1);
    pAVar4 = Abc_AigConst1(_iVar_local);
    pAVar4 = Abc_ObjNot(pAVar4);
    (pNext->field_6).pCopy = pAVar4;
    pAVar4 = Abc_AigConst1(_iVar_local);
    (pNext->field_5).pData = pAVar4;
    for (local_44 = 0; iVar3 = Vec_PtrSize((Vec_Ptr_t *)pObj), local_44 < iVar3;
        local_44 = local_44 + 1) {
      pNext = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_44);
      local_58 = pNext;
      if (pNext != (Abc_Obj_t *)0x0) {
        local_58 = (pNext->field_6).pCopy;
      }
      pFanin = local_58;
      while (pNext != (Abc_Obj_t *)0x0) {
        pAVar4 = Abc_ObjFanin0(pNext);
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar4);
        if (iVar3 == 0) {
          (pAVar4->field_6).pCopy = pAVar4;
          (pAVar4->field_5).pData = pAVar4;
        }
        pAVar4 = Abc_ObjFanin1(pNext);
        iVar3 = Abc_NodeIsTravIdCurrent(pAVar4);
        if (iVar3 == 0) {
          (pAVar4->field_6).pCopy = pAVar4;
          (pAVar4->field_5).pData = pAVar4;
        }
        pAVar1 = (Abc_Aig_t *)_iVar_local->pManFunc;
        pAVar4 = Abc_ObjChild0Copy(pNext);
        pAVar5 = Abc_ObjChild1Copy(pNext);
        pAVar4 = Abc_AigAnd(pAVar1,pAVar4,pAVar5);
        (pNext->field_6).pCopy = pAVar4;
        pAVar1 = (Abc_Aig_t *)_iVar_local->pManFunc;
        pAVar4 = Abc_ObjChild0Data(pNext);
        pAVar5 = Abc_ObjChild1Data(pNext);
        pAVar4 = Abc_AigAnd(pAVar1,pAVar4,pAVar5);
        (pNext->field_5).pData = pAVar4;
        pNext = pFanin;
        if (pFanin == (Abc_Obj_t *)0x0) {
          local_80 = pFanin;
        }
        else {
          local_80 = (pFanin->field_6).pCopy;
        }
        pFanin = local_80;
      }
    }
    Vec_PtrFree((Vec_Ptr_t *)pObj);
    for (local_44 = 0; iVar3 = Abc_NtkCoNum(_iVar_local), local_44 < iVar3; local_44 = local_44 + 1)
    {
      pNext = Abc_NtkCo(_iVar_local,local_44);
      iVar3 = Abc_NodeIsTravIdCurrent(pNext);
      if (iVar3 != 0) {
        pAVar4 = Abc_ObjFanin0(pNext);
        if (fVerbose_local == 0) {
          pAVar1 = (Abc_Aig_t *)_iVar_local->pManFunc;
          pAVar5 = Abc_ObjChild0Copy(pNext);
          pAVar6 = Abc_ObjChild0Data(pNext);
          pFanin = Abc_AigOr(pAVar1,pAVar5,pAVar6);
        }
        else {
          pAVar1 = (Abc_Aig_t *)_iVar_local->pManFunc;
          pAVar5 = Abc_ObjChild0Copy(pNext);
          pAVar6 = Abc_ObjChild0Data(pNext);
          pFanin = Abc_AigAnd(pAVar1,pAVar5,pAVar6);
        }
        iVar3 = Abc_ObjFaninC0(pNext);
        pAVar5 = Abc_ObjNotCond(pFanin,iVar3);
        pAVar6 = Abc_ObjRegular(pAVar5);
        if (pAVar6 != pAVar4) {
          Abc_ObjPatchFanin(pNext,pAVar4,pAVar5);
        }
      }
    }
    return 1;
  }
  __assert_fail("iVar < Abc_NtkCiNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                ,0x59,"int Abc_NtkQuantify(Abc_Ntk_t *, int, int, int)");
}

Assistant:

int Abc_NtkQuantify( Abc_Ntk_t * pNtk, int fUniv, int iVar, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNext, * pFanin;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( iVar < Abc_NtkCiNum(pNtk) );

    // collect the internal nodes
    pObj = Abc_NtkCi( pNtk, iVar );
    vNodes = Abc_NtkDfsReverseNodes( pNtk, &pObj, 1 );

    // assign the cofactors of the CI node to be constants
    pObj->pCopy = Abc_ObjNot( Abc_AigConst1(pNtk) ); 
    pObj->pData = Abc_AigConst1(pNtk); 

    // quantify the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        for ( pNext = pObj? pObj->pCopy : pObj; pObj; pObj = pNext, pNext = pObj? pObj->pCopy : pObj )
        {
            pFanin = Abc_ObjFanin0(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
            {
                pFanin->pCopy = pFanin;
                pFanin->pData = pFanin;
            }
            pFanin = Abc_ObjFanin1(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
            {
                pFanin->pCopy = pFanin;
                pFanin->pData = pFanin;
            }
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Data(pObj), Abc_ObjChild1Data(pObj) );
        }
    }
    Vec_PtrFree( vNodes );

    // update the affected COs
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        pFanin = Abc_ObjFanin0(pObj);
        // get the result of quantification
        if ( fUniv )
            pNext = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Data(pObj) );
        else
            pNext = Abc_AigOr( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Data(pObj) );
        pNext = Abc_ObjNotCond( pNext, Abc_ObjFaninC0(pObj) );
        if ( Abc_ObjRegular(pNext) == pFanin )
            continue;
        // update the fanins of the CO
        Abc_ObjPatchFanin( pObj, pFanin, pNext );
//        if ( Abc_ObjFanoutNum(pFanin) == 0 )
//            Abc_AigDeleteNode( pNtk->pManFunc, pFanin );
    }

    // make sure the node has no fanouts
//    pObj = Abc_NtkCi( pNtk, iVar );
//    assert( Abc_ObjFanoutNum(pObj) == 0 );
    return 1;
}